

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

bool __thiscall
Sudoku::fieldCheck(Sudoku *this,
                  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                  FieldVector *testFields,bool recordFullFurtherWays,bool debug)

{
  int *piVar1;
  pointer psVar2;
  _List_node_base *p_Var3;
  Field *this_00;
  int iVar4;
  int posX;
  int posY;
  int posZ;
  int value;
  ostream *poVar5;
  pointer psVar6;
  string local_50;
  
  psVar6 = (testFields->
           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  psVar2 = (testFields->
           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar6 == psVar2) {
LAB_00110a66:
      return psVar6 != psVar2;
    }
    iVar4 = Field::value((psVar6->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    if (iVar4 == 0) {
      iVar4 = Field::n_possible((psVar6->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
      if (iVar4 == 1) {
        if (debug) {
          poVar5 = std::operator<<((ostream *)&std::cout,"  Field check: field (");
          Field::pos_abi_cxx11_
                    (&local_50,
                     (psVar6->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          poVar5 = std::operator<<(poVar5,(string *)&local_50);
          poVar5 = std::operator<<(poVar5,") must be ");
          iVar4 = Field::onePossibleValue
                            ((psVar6->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ;
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
          poVar5 = std::operator<<(poVar5,"");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)&local_50);
        }
        p_Var3 = (furtherWays_->
                 super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>).
                 _M_impl._M_node.super__List_node_base._M_prev;
        piVar1 = (int *)((long)&p_Var3[1]._M_prev + 4);
        *piVar1 = *piVar1 + 1;
        iVar4 = Field::id((psVar6->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        posX = Field::pos_x((psVar6->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        posY = Field::pos_y((psVar6->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        posZ = Field::pos_z((psVar6->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        value = Field::onePossibleValue
                          ((psVar6->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        FurtherWays::addWay((FurtherWays *)(p_Var3 + 1),iVar4,posX,posY,posZ,value,
                            onlyPossibilityInField);
        if (!recordFullFurtherWays) {
          this_00 = (psVar6->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          iVar4 = Field::onePossibleValue(this_00);
          Field::setValue(this_00,iVar4);
          goto LAB_00110a66;
        }
      }
    }
    psVar6 = psVar6 + 1;
  } while( true );
}

Assistant:

bool Sudoku::fieldCheck(std::list<FurtherWays> &furtherWays_, FieldVector &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  // check if there are fields that can have only one possible value
  restart = false;

  // loop over fields
  for(auto &testField : testFields)
  {
    if(testField->value() == 0)   // if value is not yet set
    {
      if(testField->n_possible() == 1)    // if there is exactly one possiblility
      {
        if(debug)
          std::cout<<"  Field check: field ("<<testField->pos()<<") must be "<<testField->onePossibleValue()<<""<<std::endl;

        furtherWays_.back().nFieldCheckMatches++;
        furtherWays_.back().addWay(testField->id(), testField->pos_x(), testField->pos_y(), testField->pos_z(),
          testField->onePossibleValue(), FurtherWays::Reason::onlyPossibilityInField);

        if(!recordFullFurtherWays)
        {
          testField->setValue(testField->onePossibleValue());
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }
  return restart;
}